

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunctionType.cpp
# Opt level: O3

ScriptFunctionType * Js::ScriptFunctionType::New(FunctionProxy *proxy,bool isShared)

{
  Type TVar1;
  JavascriptLibrary *this;
  DynamicObject *prototype;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  FunctionInfo *pFVar7;
  undefined4 extraout_var;
  DynamicTypeHandler *typeHandler;
  ScriptFunctionType *pSVar8;
  Type *pTVar9;
  
  pSVar5 = FunctionProxy::GetScriptContext(proxy);
  this = (pSVar5->super_ScriptContextBase).javascriptLibrary;
  pFVar7 = (proxy->functionInfo).ptr;
  if (pFVar7 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4ea,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar3) goto LAB_00dcfc05;
    *puVar6 = 0;
    pFVar7 = (proxy->functionInfo).ptr;
  }
  if ((pFVar7->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4eb,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) goto LAB_00dcfc05;
    *puVar6 = 0;
    pFVar7 = (proxy->functionInfo).ptr;
  }
  pTVar9 = &(this->super_JavascriptLibraryBase).asyncFunctionPrototype;
  if ((pFVar7->attributes & Async) == None) {
    pTVar9 = &(this->super_JavascriptLibraryBase).functionPrototype;
  }
  prototype = pTVar9->ptr;
  if ((pFVar7->functionBodyImpl).ptr != proxy) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4f9,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar3) {
LAB_00dcfc05:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    pFVar7 = (proxy->functionInfo).ptr;
  }
  TVar1 = pFVar7->attributes;
  iVar4 = (*(proxy->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[7])(proxy);
  typeHandler = JavascriptLibrary::ScriptFunctionTypeHandler
                          (this,(bool)((byte)TVar1 & 1),
                           (char16 *)CONCAT44(extraout_var,iVar4) == L"Anonymous function");
  pSVar8 = New(proxy,typeHandler,&prototype->super_RecyclableObject,isShared);
  return pSVar8;
}

Assistant:

ScriptFunctionType * ScriptFunctionType::New(FunctionProxy * proxy, bool isShared)
    {
        ScriptContext * scriptContext = proxy->GetScriptContext();
        JavascriptLibrary * library = scriptContext->GetLibrary();
        DynamicObject * functionPrototype = proxy->IsAsync() ? library->GetAsyncFunctionPrototype() : library->GetFunctionPrototype();
        DynamicTypeHandler * typeHandler = library->ScriptFunctionTypeHandler(!proxy->IsConstructor(), proxy->GetIsAnonymousFunction());

        return New(proxy, typeHandler, functionPrototype, isShared);
    }